

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuImage.cpp
# Opt level: O0

void createCoverMatrix(vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                       *coverMatrix)

{
  int iVar1;
  int header;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *coverMatrix_local;
  
  iVar1 = createCellConstraints(coverMatrix,0);
  iVar1 = createRowConstraints(coverMatrix,iVar1);
  iVar1 = createColumnConstraints(coverMatrix,iVar1);
  createBoxConstraints(coverMatrix,iVar1);
  return;
}

Assistant:

void createCoverMatrix(vector<vector<bool>> &coverMatrix){ 
    //coverMatrix[SIZE*SIZE*MAX_VALUE][SIZE * SIZE * CONSTRAINTS];

    int header = 0;
    header = createCellConstraints(coverMatrix, header);
    header = createRowConstraints(coverMatrix, header);
    header = createColumnConstraints(coverMatrix, header);
    createBoxConstraints(coverMatrix, header);

}